

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void wcsdump(char *e,wchar_t *w)

{
  uint uVar1;
  uint *puVar2;
  uint *in_RSI;
  undefined8 in_RDI;
  uint c;
  uint *local_10;
  
  logprintf("      %s = ",in_RDI);
  if (in_RSI == (uint *)0x0) {
    logprintf("(null)");
  }
  else {
    logprintf("\"");
    local_10 = in_RSI;
    while (*local_10 != 0) {
      puVar2 = local_10 + 1;
      uVar1 = *local_10;
      local_10 = puVar2;
      if ((uVar1 < 0x20) || (0x7e < uVar1)) {
        if (uVar1 < 0x100) {
          logprintf("\\x%02X",(ulong)uVar1);
        }
        else if (uVar1 < 0x10000) {
          logprintf("\\u%04X",(ulong)uVar1);
        }
        else {
          logprintf("\\U%08X",(ulong)uVar1);
        }
      }
      else {
        logprintf("%c",(ulong)uVar1);
      }
    }
    logprintf("\"\n");
  }
  return;
}

Assistant:

static void
wcsdump(const char *e, const wchar_t *w)
{
	logprintf("      %s = ", e);
	if (w == NULL) {
		logprintf("(null)");
		return;
	}
	logprintf("\"");
	while (*w != L'\0') {
		unsigned int c = *w++;
		if (c >= 32 && c < 127)
			logprintf("%c", c);
		else if (c < 256)
			logprintf("\\x%02X", c);
		else if (c < 0x10000)
			logprintf("\\u%04X", c);
		else
			logprintf("\\U%08X", c);
	}
	logprintf("\"\n");
}